

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

void apx_socketServer_tcp_accept(void *arg,msocket_server_tag *srv,msocket_t *sock)

{
  apx_socketServerConnection_t *paVar1;
  apx_socketServerConnection_t *new_connection;
  apx_socketServer_t *self;
  msocket_t *sock_local;
  msocket_server_tag *srv_local;
  void *arg_local;
  
  if (arg != (void *)0x0) {
    paVar1 = apx_socketServerConnection_new(sock);
    if (paVar1 == (apx_socketServerConnection_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server.c"
                    ,0xf8,
                    "void apx_socketServer_tcp_accept(void *, struct msocket_server_tag *, msocket_t *)"
                   );
    }
    apx_server_accept_connection(*(undefined8 *)((long)arg + 0x1f0),paVar1);
  }
  return;
}

Assistant:

static void apx_socketServer_tcp_accept(void *arg, struct msocket_server_tag *srv, SOCKET_TYPE *sock)
{
   apx_socketServer_t *self = (apx_socketServer_t*) arg;
   (void)srv;
#if APX_DEBUG_ENABLE
   printf("[SOCKET-SERVER] New TCP connection\n");
#endif
   if (self != NULL)
   {
      apx_socketServerConnection_t *new_connection = apx_socketServerConnection_new(sock);
      ///TODO: Add support for connection tag
      if (new_connection != NULL)
      {
         apx_server_accept_connection(self->parent, (apx_serverConnection_t*)new_connection);
      }
      else
      {
         ///TODO: cleanup socket object
         assert(0);
      }
   }
}